

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorWell::dropEvent(QColorWell *this,QDropEvent *e)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QRgb _t2;
  QPoint QVar4;
  QPoint QVar5;
  long in_FS_OFFSET;
  QDropEvent QVar6;
  QColor QVar7;
  QPointF local_78;
  undefined8 local_68;
  undefined4 local_60;
  undefined4 local_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_5c = 0xaaaaaaaa;
  QMimeData::colorData();
  QVar7 = qvariant_cast<QColor>((QVariant *)&local_58);
  local_68 = QVar7._0_8_;
  local_60 = QVar7.ct._4_4_;
  local_5c = CONCAT22(local_5c._2_2_,QVar7.ct._8_2_);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QVar6 = (QDropEvent)(QVar7.cspec != Invalid);
  if ((bool)QVar6) {
    local_58.shared = (PrivateShared *)*(undefined8 *)(e + 0x10);
    local_58._8_8_ = *(undefined8 *)(e + 0x18);
    QVar4 = QPointF::toPoint((QPointF *)&local_58);
    iVar1 = (this->super_QWellArray).cellh;
    local_78.xp = *(qreal *)(e + 0x10);
    local_78.yp = *(qreal *)(e + 0x18);
    QVar5 = QPointF::toPoint(&local_78);
    iVar3 = QWellArray::columnAt(&this->super_QWellArray,QVar5.xp.m_i.m_i);
    iVar2 = (this->super_QWellArray).nrows;
    _t2 = QColor::rgb();
    QWellArray::colorChanged(&this->super_QWellArray,QVar4.yp.m_i.m_i / iVar1 + iVar3 * iVar2,_t2);
  }
  e[0xc] = QVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorWell::dropEvent(QDropEvent *e)
{
    QColor col = qvariant_cast<QColor>(e->mimeData()->colorData());
    if (col.isValid()) {
        int i = rowAt(e->position().toPoint().y()) + columnAt(e->position().toPoint().x()) * numRows();
        emit colorChanged(i, col.rgb());
        e->accept();
    } else {
        e->ignore();
    }
}